

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::OFFImporter::CanRead(OFFImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"off");
  bVar2 = true;
  if (!bVar1) {
    if (extension._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        tokens[0] = "off";
        bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,3,false,false);
      }
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool OFFImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if (extension == "off")
        return true;
    else if (!extension.length() || checkSig)
    {
        if (!pIOHandler)return true;
        const char* tokens[] = {"off"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,3);
    }
    return false;
}